

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O1

void pty_size(Backend *be,int width,int height)

{
  int ypixel;
  int xpixel;
  winsize size;
  
  *(int *)((long)&be[-5].interactor + 4) = width;
  *(int *)&be[-4].vt = height;
  if (-1 < *(int *)&be[-0x10c].interactor) {
    (*(be[-0x106].interactor)->vt[5].description)(be[-0x106].interactor);
    ioctl(*(int *)&be[-0x10c].interactor,0x5414);
  }
  return;
}

Assistant:

static void pty_size(Backend *be, int width, int height)
{
    Pty *pty = container_of(be, Pty, backend);
    struct winsize size;
    int xpixel = 0, ypixel = 0;

    pty->term_width = width;
    pty->term_height = height;

    if (pty->master_fd < 0)
        return;

    seat_get_window_pixel_size(pty->seat, &xpixel, &ypixel);

    size.ws_row = (unsigned short)pty->term_height;
    size.ws_col = (unsigned short)pty->term_width;
    size.ws_xpixel = (unsigned short)xpixel;
    size.ws_ypixel = (unsigned short)ypixel;
    ioctl(pty->master_fd, TIOCSWINSZ, (void *)&size);
    return;
}